

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O0

HT_ErrorCode ht_file_dump_listener_flush(HT_FileDumpListener *listener,HT_Boolean flush_stream)

{
  HT_Boolean HVar1;
  int iVar2;
  HT_ErrorCode local_20;
  HT_ErrorCode ret;
  HT_Boolean flush_stream_local;
  HT_FileDumpListener *listener_local;
  
  local_20 = HT_ERR_OK;
  ht_mutex_lock(listener->mtx);
  HVar1 = _ht_file_dump_listener_is_stopped(listener);
  if (HVar1 == 0) {
    ht_listener_buffer_flush(&listener->buffer,_ht_file_dump_listener_flush,listener);
    if (flush_stream == 1) {
      iVar2 = fflush((FILE *)listener->p_file);
      local_20 = (HT_ErrorCode)(iVar2 != 0);
    }
    ht_mutex_unlock(listener->mtx);
    listener_local._4_4_ = local_20;
  }
  else {
    ht_mutex_unlock(listener->mtx);
    listener_local._4_4_ = HT_ERR_OK;
  }
  return listener_local._4_4_;
}

Assistant:

HT_ErrorCode
ht_file_dump_listener_flush(HT_FileDumpListener* listener, HT_Boolean flush_stream)
{
    HT_ErrorCode ret = HT_ERR_OK;

    ht_mutex_lock(listener->mtx);

    if (_ht_file_dump_listener_is_stopped(listener))
    {
        ht_mutex_unlock(listener->mtx);
        return ret;
    }

    ht_listener_buffer_flush(&listener->buffer, _ht_file_dump_listener_flush, listener);

    if (flush_stream == HT_TRUE)
    {
        if (fflush(listener->p_file) != 0)
        {
            ret = HT_ERR_UNKNOWN;
        }
    }

    ht_mutex_unlock(listener->mtx);

    return ret;
}